

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

bool absl::cord_internal::CordRepBtree::IsValid(CordRepBtree *tree,bool shallow)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  CordRepBtree *pCVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  iterator ppCVar9;
  AlphaNum *a;
  AlphaNum *a_00;
  CordRep *edge_1;
  iterator __end3;
  iterator __begin3;
  Span<absl::cord_internal::CordRep_*const> *local_158;
  Span<absl::cord_internal::CordRep_*const> *__range3;
  string local_120;
  AlphaNum local_100;
  string local_d0;
  char *local_b0;
  char *absl_raw_log_internal_basename_10;
  char *absl_raw_log_internal_basename_9;
  char *absl_raw_log_internal_basename_8;
  char *absl_raw_log_internal_basename_7;
  char *absl_raw_log_internal_basename_6;
  CordRep *edge;
  iterator __end2;
  iterator __begin2;
  Span<absl::cord_internal::CordRep_*const> *local_60;
  Span<absl::cord_internal::CordRep_*const> *__range2;
  size_t child_length;
  char *absl_raw_log_internal_basename_5;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  char *absl_raw_log_internal_basename_2;
  char *absl_raw_log_internal_basename_1;
  char *absl_raw_log_internal_basename;
  CordRepBtree *pCStack_18;
  bool shallow_local;
  CordRepBtree *tree_local;
  
  absl_raw_log_internal_basename._7_1_ = shallow;
  pCStack_18 = tree;
  if (tree == (CordRepBtree *)0x0) {
    absl_raw_log_internal_basename_1 = "cord_rep_btree.cc";
    raw_log_internal::RawLog
              (kError,"cord_rep_btree.cc",0x1bb,"CordRepBtree::CheckValid() FAILED: %s",
               "tree != nullptr");
    tree_local._7_1_ = false;
  }
  else {
    bVar1 = CordRep::IsBtree(&tree->super_CordRep);
    if (bVar1) {
      iVar2 = height(pCStack_18);
      if (iVar2 < 0xc) {
        sVar4 = begin(pCStack_18);
        sVar5 = capacity(pCStack_18);
        if (sVar4 < sVar5) {
          sVar4 = end(pCStack_18);
          sVar5 = capacity(pCStack_18);
          if (sVar5 < sVar4) {
            absl_raw_log_internal_basename_5 = "cord_rep_btree.cc";
            raw_log_internal::RawLog
                      (kError,"cord_rep_btree.cc",0x1bf,"CordRepBtree::CheckValid() FAILED: %s",
                       "tree->end() <= tree->capacity()");
            tree_local._7_1_ = false;
          }
          else {
            sVar4 = begin(pCStack_18);
            sVar5 = end(pCStack_18);
            if (sVar5 < sVar4) {
              child_length = (long)
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                             + 0x6e;
              raw_log_internal::RawLog
                        (kError,"cord_rep_btree.cc",0x1c0,"CordRepBtree::CheckValid() FAILED: %s",
                         "tree->begin() <= tree->end()");
              tree_local._7_1_ = false;
            }
            else {
              __range2 = (Span<absl::cord_internal::CordRep_*const> *)0x0;
              ___begin2 = Edges(pCStack_18);
              local_60 = (Span<absl::cord_internal::CordRep_*const> *)&__begin2;
              __end2 = Span<absl::cord_internal::CordRep_*const>::begin(local_60);
              edge = (CordRep *)Span<absl::cord_internal::CordRep_*const>::end(local_60);
              for (; (CordRep *)__end2 != edge; __end2 = __end2 + 1) {
                absl_raw_log_internal_basename_6 = (char *)*__end2;
                if ((CordRep *)absl_raw_log_internal_basename_6 == (CordRep *)0x0) {
                  absl_raw_log_internal_basename_7 = "cord_rep_btree.cc";
                  raw_log_internal::RawLog
                            (kError,"cord_rep_btree.cc",0x1c3,
                             "CordRepBtree::CheckValid() FAILED: %s","edge != nullptr");
                  return false;
                }
                iVar2 = height(pCStack_18);
                if (iVar2 < 1) {
                  bVar1 = IsDataEdge((CordRep *)absl_raw_log_internal_basename_6);
                  if (!bVar1) {
                    absl_raw_log_internal_basename_10 = "cord_rep_btree.cc";
                    raw_log_internal::RawLog
                              (kError,"cord_rep_btree.cc",0x1c8,
                               "CordRepBtree::CheckValid() FAILED: %s","IsDataEdge(edge)");
                    return false;
                  }
                }
                else {
                  bVar1 = CordRep::IsBtree((CordRep *)absl_raw_log_internal_basename_6);
                  if (!bVar1) {
                    absl_raw_log_internal_basename_8 = "cord_rep_btree.cc";
                    raw_log_internal::RawLog
                              (kError,"cord_rep_btree.cc",0x1c5,
                               "CordRepBtree::CheckValid() FAILED: %s","edge->IsBtree()");
                    return false;
                  }
                  pCVar6 = CordRep::btree((CordRep *)absl_raw_log_internal_basename_6);
                  iVar2 = height(pCVar6);
                  iVar3 = height(pCStack_18);
                  if (iVar2 != iVar3 + -1) {
                    absl_raw_log_internal_basename_9 = "cord_rep_btree.cc";
                    raw_log_internal::RawLog
                              (kError,"cord_rep_btree.cc",0x1c6,
                               "CordRepBtree::CheckValid() FAILED: %s",
                               "edge->btree()->height() == tree->height() - 1");
                    return false;
                  }
                }
                __range2 = (Span<absl::cord_internal::CordRep_*const> *)
                           ((long)&__range2->ptr_ + *(long *)absl_raw_log_internal_basename_6);
              }
              if (__range2 ==
                  (Span<absl::cord_internal::CordRep_*const> *)(pCStack_18->super_CordRep).length) {
                if ((((absl_raw_log_internal_basename._7_1_ & 1) == 0) ||
                    (bVar1 = IsCordBtreeExhaustiveValidationEnabled(), bVar1)) &&
                   (iVar2 = height(pCStack_18), 0 < iVar2)) {
                  ___begin3 = Edges(pCStack_18);
                  local_158 = (Span<absl::cord_internal::CordRep_*const> *)&__begin3;
                  __end3 = Span<absl::cord_internal::CordRep_*const>::begin(local_158);
                  ppCVar9 = Span<absl::cord_internal::CordRep_*const>::end(local_158);
                  for (; __end3 != ppCVar9; __end3 = __end3 + 1) {
                    pCVar6 = CordRep::btree(*__end3);
                    bVar1 = IsValid(pCVar6,(bool)(absl_raw_log_internal_basename._7_1_ & 1));
                    if (!bVar1) {
                      return false;
                    }
                  }
                }
                tree_local._7_1_ = true;
              }
              else {
                local_b0 = "cord_rep_btree.cc";
                AlphaNum::AlphaNum(&local_100,(unsigned_long)__range2);
                StrCat_abi_cxx11_(&local_d0,(absl *)&local_100,a);
                uVar7 = std::__cxx11::string::c_str();
                AlphaNum::AlphaNum((AlphaNum *)&__range3,(pCStack_18->super_CordRep).length);
                StrCat_abi_cxx11_(&local_120,(absl *)&__range3,a_00);
                uVar8 = std::__cxx11::string::c_str();
                raw_log_internal::RawLog
                          (kError,"cord_rep_btree.cc",0x1cc,
                           "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)","child_length",
                           "tree->length",uVar7,uVar8);
                std::__cxx11::string::~string((string *)&local_120);
                std::__cxx11::string::~string((string *)&local_d0);
                tree_local._7_1_ = false;
              }
            }
          }
        }
        else {
          absl_raw_log_internal_basename_4 = "cord_rep_btree.cc";
          raw_log_internal::RawLog
                    (kError,"cord_rep_btree.cc",0x1be,"CordRepBtree::CheckValid() FAILED: %s",
                     "tree->begin() < tree->capacity()");
          tree_local._7_1_ = false;
        }
      }
      else {
        absl_raw_log_internal_basename_3 = "cord_rep_btree.cc";
        raw_log_internal::RawLog
                  (kError,"cord_rep_btree.cc",0x1bd,"CordRepBtree::CheckValid() FAILED: %s",
                   "tree->height() <= kMaxHeight");
        tree_local._7_1_ = false;
      }
    }
    else {
      absl_raw_log_internal_basename_2 = "cord_rep_btree.cc";
      raw_log_internal::RawLog
                (kError,"cord_rep_btree.cc",0x1bc,"CordRepBtree::CheckValid() FAILED: %s",
                 "tree->IsBtree()");
      tree_local._7_1_ = false;
    }
  }
  return tree_local._7_1_;
}

Assistant:

bool CordRepBtree::IsValid(const CordRepBtree* tree, bool shallow) {
#define NODE_CHECK_VALID(x)                                           \
  if (!(x)) {                                                         \
    ABSL_RAW_LOG(ERROR, "CordRepBtree::CheckValid() FAILED: %s", #x); \
    return false;                                                     \
  }
#define NODE_CHECK_EQ(x, y)                                                    \
  if ((x) != (y)) {                                                            \
    ABSL_RAW_LOG(ERROR,                                                        \
                 "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)", #x, \
                 #y, absl::StrCat(x).c_str(), absl::StrCat(y).c_str());        \
    return false;                                                              \
  }

  NODE_CHECK_VALID(tree != nullptr);
  NODE_CHECK_VALID(tree->IsBtree());
  NODE_CHECK_VALID(tree->height() <= kMaxHeight);
  NODE_CHECK_VALID(tree->begin() < tree->capacity());
  NODE_CHECK_VALID(tree->end() <= tree->capacity());
  NODE_CHECK_VALID(tree->begin() <= tree->end());
  size_t child_length = 0;
  for (CordRep* edge : tree->Edges()) {
    NODE_CHECK_VALID(edge != nullptr);
    if (tree->height() > 0) {
      NODE_CHECK_VALID(edge->IsBtree());
      NODE_CHECK_VALID(edge->btree()->height() == tree->height() - 1);
    } else {
      NODE_CHECK_VALID(IsDataEdge(edge));
    }
    child_length += edge->length;
  }
  NODE_CHECK_EQ(child_length, tree->length);
  if ((!shallow || IsCordBtreeExhaustiveValidationEnabled()) &&
      tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!IsValid(edge->btree(), shallow)) return false;
    }
  }
  return true;

#undef NODE_CHECK_VALID
#undef NODE_CHECK_EQ
}